

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.cpp
# Opt level: O0

void poly1305_donna::poly1305_init(poly1305_context *st,uchar *key)

{
  long lVar1;
  uint32_t uVar2;
  uint *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = ReadLE32((uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  *in_RDI = uVar2 & 0x3ffffff;
  uVar2 = ReadLE32((uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  in_RDI[1] = uVar2 >> 2 & 0x3ffff03;
  uVar2 = ReadLE32((uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  in_RDI[2] = uVar2 >> 4 & 0x3ffc0ff;
  uVar2 = ReadLE32((uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  in_RDI[3] = uVar2 >> 6 & 0x3f03fff;
  uVar2 = ReadLE32((uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  in_RDI[4] = uVar2 >> 8 & 0xfffff;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  uVar2 = ReadLE32((uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  in_RDI[10] = uVar2;
  uVar2 = ReadLE32((uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  in_RDI[0xb] = uVar2;
  uVar2 = ReadLE32((uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  in_RDI[0xc] = uVar2;
  uVar2 = ReadLE32((uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  in_RDI[0xd] = uVar2;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  *(undefined1 *)(in_RDI + 0x14) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void poly1305_init(poly1305_context *st, const unsigned char key[32]) noexcept {
    /* r &= 0xffffffc0ffffffc0ffffffc0fffffff */
    st->r[0] = (ReadLE32(&key[ 0])     ) & 0x3ffffff;
    st->r[1] = (ReadLE32(&key[ 3]) >> 2) & 0x3ffff03;
    st->r[2] = (ReadLE32(&key[ 6]) >> 4) & 0x3ffc0ff;
    st->r[3] = (ReadLE32(&key[ 9]) >> 6) & 0x3f03fff;
    st->r[4] = (ReadLE32(&key[12]) >> 8) & 0x00fffff;

    /* h = 0 */
    st->h[0] = 0;
    st->h[1] = 0;
    st->h[2] = 0;
    st->h[3] = 0;
    st->h[4] = 0;

    /* save pad for later */
    st->pad[0] = ReadLE32(&key[16]);
    st->pad[1] = ReadLE32(&key[20]);
    st->pad[2] = ReadLE32(&key[24]);
    st->pad[3] = ReadLE32(&key[28]);

    st->leftover = 0;
    st->final = 0;
}